

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

int isobusfs_cmn_set_linger(int sock)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint __errnum;
  linger linger_opt;
  
  linger_opt.l_onoff = 1;
  linger_opt.l_linger = 0;
  iVar1 = setsockopt(sock,1,0xd,&linger_opt,8);
  __errnum = 0;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_ERROR,"setsockopt(SO_LINGER): %d (%s)",(ulong)__errnum,pcVar3);
  }
  return __errnum;
}

Assistant:

int isobusfs_cmn_set_linger(int sock)
{
	struct linger linger_opt;
	int ret;

	linger_opt.l_onoff = 1;
	linger_opt.l_linger = 0;
	ret = setsockopt(sock, SOL_SOCKET, SO_LINGER, &linger_opt,
			 sizeof(linger_opt));
	if (ret < 0) {
		ret = -errno;
		pr_err("setsockopt(SO_LINGER): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}